

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

CURLcode cpfds_add_sock(curl_pollfds *cpfds,curl_socket_t sock,short events,_Bool fold)

{
  ulong uVar1;
  short *psVar2;
  long lVar3;
  byte bVar4;
  pollfd *__dest;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = cpfds->n;
  if ((int)uVar6 < 0 || !fold) {
LAB_001494a6:
    if (uVar6 < cpfds->count) {
      __dest = cpfds->pfds;
    }
    else {
      uVar6 = cpfds->count + 100;
      __dest = (pollfd *)(*Curl_ccalloc)((size_t)uVar6,8);
      if (__dest == (pollfd *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(__dest,cpfds->pfds,(ulong)cpfds->count << 3);
      bVar4 = cpfds->field_0x10;
      if ((bVar4 & 1) != 0) {
        (*Curl_cfree)(cpfds->pfds);
        bVar4 = cpfds->field_0x10;
      }
      cpfds->pfds = __dest;
      cpfds->count = uVar6;
      cpfds->field_0x10 = bVar4 | 1;
      uVar6 = cpfds->n;
    }
    __dest[uVar6].fd = sock;
    __dest[uVar6].events = events;
    cpfds->n = uVar6 + 1;
  }
  else {
    uVar5 = (ulong)uVar6;
    do {
      if ((long)uVar5 < 1) goto LAB_001494a6;
      uVar1 = uVar5 - 1;
      lVar3 = uVar5 - 1;
      uVar5 = uVar1;
    } while (cpfds->pfds[lVar3].fd != sock);
    psVar2 = &cpfds->pfds[uVar1].events;
    *psVar2 = *psVar2 | events;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cpfds_add_sock(struct curl_pollfds *cpfds,
                               curl_socket_t sock, short events, bool fold)
{
  int i;

  if(fold && cpfds->n <= INT_MAX) {
    for(i = (int)cpfds->n - 1; i >= 0; --i) {
      if(sock == cpfds->pfds[i].fd) {
        cpfds->pfds[i].events |= events;
        return CURLE_OK;
      }
    }
  }
  /* not folded, add new entry */
  if(cpfds->n >= cpfds->count) {
    if(cpfds_increase(cpfds, 100))
      return CURLE_OUT_OF_MEMORY;
  }
  cpfds->pfds[cpfds->n].fd = sock;
  cpfds->pfds[cpfds->n].events = events;
  ++cpfds->n;
  return CURLE_OK;
}